

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O3

void __thiscall
FOptionMenuScreenResolutionLine::FOptionMenuScreenResolutionLine
          (FOptionMenuScreenResolutionLine *this,char *action)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  FName local_14;
  
  lVar3 = 0;
  FName::NameManager::FindName(&FName::NameData,action,false);
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,(char *)"",&local_14,false);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuScreenResolutionLine_006ee218;
  auVar2 = _DAT_005d6240;
  auVar1 = _DAT_005d6230;
  do {
    auVar4._8_4_ = (int)lVar3;
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4 = (auVar4 | auVar1) ^ auVar2;
    if (auVar4._4_4_ == -0x80000000 && auVar4._0_4_ < -0x7ffffffd) {
      this->mResTexts[lVar3].Chars = FString::NullString.Nothing;
      this->mResTexts[lVar3 + 1].Chars = FString::NullString.Nothing;
    }
    lVar3 = lVar3 + 2;
  } while (lVar3 != 4);
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  this->mSelection = 0;
  this->mHighlight = -1;
  return;
}

Assistant:

FOptionMenuScreenResolutionLine(const char *action)
		: FOptionMenuItem("", action)
	{
		mSelection = 0;
		mHighlight = -1;
	}